

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void QApplicationPrivate::dispatchEnterLeave(QWidget *enter,QWidget *leave,QPointF *globalPosF)

{
  int iVar1;
  qsizetype qVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  QWidget *pQVar7;
  QWidget *pQVar8;
  QWidget *pQVar9;
  undefined8 uVar10;
  QPointingDevice *pQVar11;
  long *plVar12;
  WId WVar13;
  WId WVar14;
  QGraphicsProxyWidget *pQVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  QWidget *w;
  undefined8 *puVar21;
  QHoverEvent *pQVar22;
  QWidget *cursorWidget;
  QWidget *w_2;
  long in_FS_OFFSET;
  bool bVar23;
  byte bVar24;
  QEnterEvent enterEvent;
  QHoverEvent he;
  QArrayData *local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  undefined1 *puStack_150;
  undefined1 *local_148;
  undefined1 *puStack_140;
  undefined1 *local_138;
  undefined1 *puStack_130;
  undefined1 *local_128;
  undefined1 *puStack_120;
  QPointF local_118;
  QPointF local_108;
  QPointF local_f8;
  QWidget local_e8 [2];
  undefined1 *local_88;
  undefined1 *puStack_80;
  QArrayData *local_78;
  long lStack_70;
  qsizetype local_68;
  QArrayData *local_58;
  long lStack_50;
  ulong local_48;
  long local_38;
  
  bVar24 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((enter == leave) || (enter == (QWidget *)0x0 && leave == (QWidget *)0x0)) goto LAB_002bd2ae;
  local_58 = (QArrayData *)0x0;
  lStack_50 = 0;
  bVar23 = false;
  local_48 = 0;
  local_68 = 0;
  local_78 = (QArrayData *)0x0;
  lStack_70 = 0;
  if (enter != (QWidget *)0x0 && leave != (QWidget *)0x0) {
    pQVar7 = QWidget::window(leave);
    pQVar8 = QWidget::window(enter);
    bVar23 = pQVar7 == pQVar8;
  }
  if (leave != (QWidget *)0x0 && !bVar23) {
    pQVar7 = leave;
    do {
      local_e8[0]._0_8_ = pQVar7;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)&local_58,local_48,(QWidget **)local_e8);
      QList<QWidget_*>::end((QList<QWidget_*> *)&local_58);
      if (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) break;
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
    } while (pQVar7 != (QWidget *)0x0);
  }
  if (enter != (QWidget *)0x0 && !bVar23) {
    pQVar7 = enter;
    do {
      local_e8[0]._0_8_ = pQVar7;
      QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                ((QPodArrayOps<QWidget*> *)&local_78,local_68,(QWidget **)local_e8);
      QList<QWidget_*>::end((QList<QWidget_*> *)&local_78);
      if (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) break;
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
    } while (pQVar7 != (QWidget *)0x0);
  }
  if (bVar23) {
    iVar5 = 0;
    iVar16 = 0;
    if (((enter->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      iVar16 = 0;
      pQVar7 = enter;
      do {
        pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
        if (pQVar7 == (QWidget *)0x0) break;
        iVar16 = iVar16 + 1;
      } while (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    }
    pQVar7 = enter;
    iVar1 = iVar16;
    if (((leave->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      iVar5 = 0;
      pQVar8 = leave;
      do {
        pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
        if (pQVar8 == (QWidget *)0x0) break;
        iVar5 = iVar5 + 1;
      } while (((pQVar8->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i & 1) == 0);
    }
    for (; pQVar8 = leave, iVar5 < iVar16; iVar16 = iVar16 + -1) {
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
      iVar1 = iVar5;
    }
    for (; iVar1 < iVar5; iVar5 = iVar5 + -1) {
      pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
    }
    while ((pQVar7 != pQVar8 &&
           (((pQVar7->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0))) {
      pQVar7 = *(QWidget **)(*(long *)&pQVar7->field_0x8 + 0x10);
      pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
    }
    if (pQVar8 != leave) {
      do {
        local_e8[0]._0_8_ = leave;
        QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                  ((QPodArrayOps<QWidget*> *)&local_58,local_48,(QWidget **)local_e8);
        QList<QWidget_*>::end((QList<QWidget_*> *)&local_58);
        leave = *(QWidget **)(*(long *)&leave->field_0x8 + 0x10);
      } while (leave != pQVar8);
    }
    if (pQVar7 != enter) {
      pQVar8 = enter;
      do {
        local_e8[0]._0_8_ = pQVar8;
        QtPrivate::QPodArrayOps<QWidget*>::emplace<QWidget*&>
                  ((QPodArrayOps<QWidget*> *)&local_78,local_68,(QWidget **)local_e8);
        QList<QWidget_*>::end((QList<QWidget_*> *)&local_78);
        pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10);
      } while (pQVar8 != pQVar7);
    }
  }
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
  QEvent::QEvent((QEvent *)&local_88,Leave);
  if (local_48 != 0) {
    uVar19 = 0;
    do {
      pQVar7 = *(QWidget **)(lStack_50 + uVar19 * 8);
      pQVar8 = QApplication::activeModalWidget();
      if ((pQVar8 == (QWidget *)0x0) || (bVar23 = tryModalHelper(pQVar7,(QWidget **)0x0), bVar23)) {
        QCoreApplication::sendEvent(&pQVar7->super_QObject,(QEvent *)&local_88);
        bVar23 = QWidget::testAttribute_helper(pQVar7,WA_Hover);
        if (bVar23) {
          pQVar8 = QApplication::activePopupWidget();
          if (pQVar8 != (QWidget *)0x0) {
            pQVar8 = QApplication::activePopupWidget();
            pQVar9 = QWidget::window(pQVar7);
            if (pQVar8 != pQVar9) goto LAB_002bce3e;
          }
          puVar21 = &DAT_00660748;
          pQVar22 = (QHoverEvent *)local_e8;
          for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
            *(undefined8 *)pQVar22 = *puVar21;
            puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
            pQVar22 = pQVar22 + (ulong)bVar24 * -0x10 + 8;
          }
          local_198 = (QArrayData *)0xbff0000000000000;
          uStack_190 = 0xbff0000000000000;
          local_f8 = QWidget::mapFromGlobal(pQVar7,globalPosF);
          uVar6 = QGuiApplication::keyboardModifiers();
          local_168 = (undefined1  [16])0x0;
          local_158 = (undefined1 *)0x0;
          uVar10 = QPointingDevice::primaryPointingDevice((QString *)local_168);
          QHoverEvent::QHoverEvent
                    ((QHoverEvent *)local_e8,0x80,&local_198,globalPosF,&local_f8,uVar6,uVar10);
          if ((QArrayData *)local_168._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_168._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_168._0_8_,2,0x10);
            }
          }
          notify_helper(*(QApplicationPrivate **)(QCoreApplication::self + 8),&pQVar7->super_QObject
                        ,(QEvent *)local_e8);
          QHoverEvent::~QHoverEvent((QHoverEvent *)local_e8);
        }
      }
LAB_002bce3e:
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_48);
  }
  qVar2 = local_68;
  if (local_68 != 0) {
    cVar3 = qIsInf(globalPosF->xp);
    if (cVar3 == '\0') {
      local_f8 = *globalPosF;
    }
    else {
      local_f8.yp = 16777215.0;
      local_f8.xp = 16777215.0;
    }
    pQVar7 = QWidget::window(*(QWidget **)(lStack_70 + -8 + qVar2 * 8));
    local_108 = QWidget::mapFromGlobal(pQVar7,&local_f8);
    lVar17 = lStack_70;
    if (local_68 != 0) {
      lVar20 = local_68 << 3;
      do {
        pQVar7 = *(QWidget **)(lVar17 + -8 + lVar20);
        pQVar8 = QApplication::activeModalWidget();
        if ((pQVar8 == (QWidget *)0x0) || (bVar23 = tryModalHelper(pQVar7,(QWidget **)0x0), bVar23))
        {
          local_118.yp._0_4_ = 0xffffffff;
          local_118.xp = -NAN;
          local_118.yp._4_4_ = 0xffffffff;
          local_118 = QWidget::mapFromGlobal(pQVar7,&local_f8);
          local_128 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_120 = &DAT_aaaaaaaaaaaaaaaa;
          local_138 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_130 = &DAT_aaaaaaaaaaaaaaaa;
          local_148 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_140 = &DAT_aaaaaaaaaaaaaaaa;
          local_158 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
          local_168._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_168._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_e8[0].super_QObject = (QObject)0x0;
          local_e8[0]._1_8_ = 0;
          local_e8[0]._9_7_ = 0;
          local_e8[0].super_QPaintDevice = (QPaintDevice)0x0;
          local_e8[0]._17_7_ = 0;
          pQVar11 = (QPointingDevice *)QPointingDevice::primaryPointingDevice((QString *)local_e8);
          QEnterEvent::QEnterEvent((QEnterEvent *)local_168,&local_118,&local_108,&local_f8,pQVar11)
          ;
          if ((QWidget *)local_e8[0]._0_8_ != (QWidget *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_e8[0]._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_e8[0]._0_8_)->_q_value).super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_e8[0]._0_8_)->_q_value).super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate((QArrayData *)local_e8[0]._0_8_,2,0x10);
            }
          }
          QCoreApplication::sendEvent(&pQVar7->super_QObject,(QEvent *)local_168);
          bVar23 = QWidget::testAttribute_helper(pQVar7,WA_Hover);
          if (bVar23) {
            pQVar8 = QApplication::activePopupWidget();
            if (pQVar8 != (QWidget *)0x0) {
              pQVar8 = QApplication::activePopupWidget();
              pQVar9 = QWidget::window(pQVar7);
              if (pQVar8 != pQVar9) goto LAB_002bd0dc;
            }
            puVar21 = &DAT_00660748;
            pQVar22 = (QHoverEvent *)local_e8;
            for (lVar18 = 0xc; lVar18 != 0; lVar18 = lVar18 + -1) {
              *(undefined8 *)pQVar22 = *puVar21;
              puVar21 = puVar21 + (ulong)bVar24 * -2 + 1;
              pQVar22 = pQVar22 + (ulong)bVar24 * -0x10 + 8;
            }
            local_178 = 0xbff0000000000000;
            uStack_170 = 0xbff0000000000000;
            uVar6 = QGuiApplication::keyboardModifiers();
            local_198 = (QArrayData *)0x0;
            uStack_190 = 0;
            local_188 = 0;
            uVar10 = QPointingDevice::primaryPointingDevice((QString *)&local_198);
            QHoverEvent::QHoverEvent
                      ((QHoverEvent *)local_e8,0x7f,&local_108,&local_178,&local_f8,uVar6,uVar10);
            if (local_198 != (QArrayData *)0x0) {
              LOCK();
              (local_198->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_198->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_198->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_198,2,0x10);
              }
            }
            plVar12 = (long *)QPointerEvent::point((longlong)local_e8);
            lVar18 = *plVar12;
            *(qreal *)(lVar18 + 0x30) = local_118.xp;
            *(qreal *)(lVar18 + 0x38) = local_118.yp;
            notify_helper(*(QApplicationPrivate **)(QCoreApplication::self + 8),
                          &pQVar7->super_QObject,(QEvent *)local_e8);
            QHoverEvent::~QHoverEvent((QHoverEvent *)local_e8);
          }
LAB_002bd0dc:
          QEnterEvent::~QEnterEvent((QEnterEvent *)local_168);
        }
        lVar20 = lVar20 + -8;
      } while (lVar20 != 0);
    }
  }
  if (enter == (QWidget *)0x0) {
    bVar23 = false;
  }
  else {
    bVar23 = true;
    if (((enter->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      bVar23 = QWidget::testAttribute_helper(enter,WA_DontShowOnScreen);
    }
  }
  if (local_48 == 0) {
LAB_002bd1d8:
    if (bVar23 != false) goto LAB_002bd1dd;
  }
  else {
    uVar19 = 0;
    pQVar7 = (QWidget *)0x0;
    do {
      pQVar8 = *(QWidget **)(lStack_50 + uVar19 * 8);
      if ((pQVar8 == (QWidget *)0x0) ||
         (((pQVar8->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)) break;
      bVar4 = QWidget::testAttribute_helper(pQVar8,WA_SetCursor);
      if (bVar4) {
        lVar17 = *(long *)&pQVar8->field_0x8;
        do {
          pQVar7 = *(QWidget **)(lVar17 + 0x10);
          if (pQVar7 == (QWidget *)0x0) {
            pQVar7 = (QWidget *)0x0;
            break;
          }
          lVar17 = *(long *)&pQVar7->field_0x8;
        } while ((*(byte *)(lVar17 + 0x1c2) & 4) != 0);
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < local_48);
    if (pQVar7 == (QWidget *)0x0) goto LAB_002bd1d8;
    if (bVar23 == false) {
LAB_002bd1a7:
      pQVar8 = QWidget::window(pQVar7);
      pQVar15 = QWidget::graphicsProxyWidget(pQVar8);
      if (pQVar15 == (QGraphicsProxyWidget *)0x0) {
        pQVar9 = desktop();
        pQVar8 = enter;
        if (pQVar9 != enter) {
          pQVar8 = pQVar7;
        }
        qt_qpa_set_cursor(pQVar8,true);
      }
      goto LAB_002bd1d8;
    }
    WVar13 = QWidget::effectiveWinId(pQVar7);
    WVar14 = QWidget::effectiveWinId(enter);
    if (WVar13 != WVar14) goto LAB_002bd1a7;
LAB_002bd1dd:
    while ((((enter->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0 &&
           ((enter->data->widget_attributes & 1) != 0))) {
      enter = *(QWidget **)(*(long *)&enter->field_0x8 + 0x10);
    }
    pQVar7 = QWidget::window(enter);
    pQVar15 = QWidget::graphicsProxyWidget(pQVar7);
    if (pQVar15 == (QGraphicsProxyWidget *)0x0) {
      qt_qpa_set_cursor(enter,true);
    }
    else {
      pQVar15 = QWidgetPrivate::nearestGraphicsProxyWidget(enter);
      QWidget::cursor(local_e8);
      QGraphicsItem::setCursor
                (&(pQVar15->super_QGraphicsWidget).super_QGraphicsObject.super_QGraphicsItem,
                 (QCursor *)local_e8);
      QCursor::~QCursor((QCursor *)local_e8);
    }
  }
  QEvent::~QEvent((QEvent *)&local_88);
  if (local_78 != (QArrayData *)0x0) {
    LOCK();
    (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_78,8,0x10);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,8,0x10);
    }
  }
LAB_002bd2ae:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplicationPrivate::dispatchEnterLeave(QWidget* enter, QWidget* leave, const QPointF &globalPosF)
{
    if ((!enter && !leave) || (enter == leave))
        return;

    QWidgetList leaveList;
    QWidgetList enterList;

    bool sameWindow = leave && enter && leave->window() == enter->window();
    if (leave && !sameWindow) {
        auto *w = leave;
        do {
            leaveList.append(w);
        } while (!w->isWindow() && (w = w->parentWidget()));
    }
    if (enter && !sameWindow) {
        auto *w = enter;
        do {
            enterList.append(w);
        } while (!w->isWindow() && (w = w->parentWidget()));
    }
    if (sameWindow) {
        int enterDepth = 0;
        int leaveDepth = 0;
        auto *e = enter;
        while (!e->isWindow() && (e = e->parentWidget()))
            enterDepth++;
        auto *l = leave;
        while (!l->isWindow() && (l = l->parentWidget()))
            leaveDepth++;
        QWidget* wenter = enter;
        QWidget* wleave = leave;
        while (enterDepth > leaveDepth) {
            wenter = wenter->parentWidget();
            enterDepth--;
        }
        while (leaveDepth > enterDepth) {
            wleave = wleave->parentWidget();
            leaveDepth--;
        }
        while (!wenter->isWindow() && wenter != wleave) {
            wenter = wenter->parentWidget();
            wleave = wleave->parentWidget();
        }

        for (auto *w = leave; w != wleave; w = w->parentWidget())
            leaveList.append(w);

        for (auto *w = enter; w != wenter; w = w->parentWidget())
            enterList.append(w);
    }

    QEvent leaveEvent(QEvent::Leave);
    for (int i = 0; i < leaveList.size(); ++i) {
        auto *w = leaveList.at(i);
        if (!QApplication::activeModalWidget() || QApplicationPrivate::tryModalHelper(w, nullptr)) {
            QCoreApplication::sendEvent(w, &leaveEvent);
            if (w->testAttribute(Qt::WA_Hover) &&
                (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == w->window())) {
                Q_ASSERT(instance());
                QHoverEvent he(QEvent::HoverLeave, QPointF(-1, -1), globalPosF, w->mapFromGlobal(globalPosF),
                               QGuiApplication::keyboardModifiers());
                qApp->d_func()->notify_helper(w, &he);
            }
        }
    }
    if (!enterList.isEmpty()) {
        // Guard against QGuiApplicationPrivate::lastCursorPosition initialized to qInf(), qInf().
        const QPointF globalPos = qIsInf(globalPosF.x())
            ? QPointF(QWIDGETSIZE_MAX, QWIDGETSIZE_MAX)
            : globalPosF;
        const QPointF windowPos = std::as_const(enterList).back()->window()->mapFromGlobal(globalPos);
        for (auto it = enterList.crbegin(), end = enterList.crend(); it != end; ++it) {
            auto *w = *it;
            if (!QApplication::activeModalWidget() || QApplicationPrivate::tryModalHelper(w, nullptr)) {
                const QPointF localPos = w->mapFromGlobal(globalPos);
                QEnterEvent enterEvent(localPos, windowPos, globalPos);
                QCoreApplication::sendEvent(w, &enterEvent);
                if (w->testAttribute(Qt::WA_Hover) &&
                        (!QApplication::activePopupWidget() || QApplication::activePopupWidget() == w->window())) {
                    QHoverEvent he(QEvent::HoverEnter, windowPos, QPointF(-1, -1), globalPos,
                                   QGuiApplication::keyboardModifiers());
                    QMutableEventPoint::setPosition(he.point(0), localPos);
                    qApp->d_func()->notify_helper(w, &he);
                }
            }
        }
    }

#ifndef QT_NO_CURSOR
    // Update cursor for alien/graphics widgets.

    const bool enterOnAlien = (enter && (isAlien(enter) || enter->testAttribute(Qt::WA_DontShowOnScreen)));
    // Whenever we leave an alien widget on X11/QPA, we need to reset its nativeParentWidget()'s cursor.
    // This is not required on Windows as the cursor is reset on every single mouse move.
    QWidget *parentOfLeavingCursor = nullptr;
    for (int i = 0; i < leaveList.size(); ++i) {
        auto *w = leaveList.at(i);
        if (!isAlien(w))
            break;
        if (w->testAttribute(Qt::WA_SetCursor)) {
            QWidget *parent = w->parentWidget();
            while (parent && parent->d_func()->data.in_destructor)
                parent = parent->parentWidget();
            parentOfLeavingCursor = parent;
            //continue looping, we need to find the downest alien widget with a cursor.
            // (downest on the screen)
        }
    }
    //check that we will not call qt_x11_enforce_cursor twice with the same native widget
    if (parentOfLeavingCursor && (!enterOnAlien
        || parentOfLeavingCursor->effectiveWinId() != enter->effectiveWinId())) {
#if QT_CONFIG(graphicsview)
        if (!parentOfLeavingCursor->window()->graphicsProxyWidget())
#endif
        {
            if (enter == QApplicationPrivate::desktop()) {
                qt_qpa_set_cursor(enter, true);
            } else {
                qt_qpa_set_cursor(parentOfLeavingCursor, true);
            }
        }
    }
    if (enterOnAlien) {
        QWidget *cursorWidget = enter;
        while (!cursorWidget->isWindow() && !cursorWidget->isEnabled())
            cursorWidget = cursorWidget->parentWidget();

        if (!cursorWidget)
            return;

#if QT_CONFIG(graphicsview)
        if (cursorWidget->window()->graphicsProxyWidget()) {
            QWidgetPrivate::nearestGraphicsProxyWidget(cursorWidget)->setCursor(cursorWidget->cursor());
        } else
#endif
        {
            qt_qpa_set_cursor(cursorWidget, true);
        }
    }
#endif
}